

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

float64 vector_pdf_entropy(float32 *p,int32 len)

{
  ulong uVar1;
  double __x;
  double dVar2;
  double dVar3;
  
  if (len < 1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    uVar1 = 0;
    do {
      if (0.0 < (float)p[uVar1]) {
        __x = (double)(float)p[uVar1];
        dVar2 = log(__x);
        dVar3 = dVar3 - dVar2 * __x;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return (float64)(dVar3 / 0.6931471805599453);
}

Assistant:

float64
vector_pdf_entropy(float32 * p, int32 len)
{
    float64 sum;
    int32 i;

    sum = 0.0;
    for (i = 0; i < len; i++) {
        if (p[i] > 0.0)
            sum -= p[i] * log(p[i]);
    }
    sum /= log(2.0);

    return sum;
}